

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

void art_shrink_at(art_t *art,art_ref_t ref)

{
  int iVar1;
  art_ref_t aVar2;
  long lVar3;
  ulong uVar4;
  int i;
  long lVar5;
  
  if ((ref & 0xff) != 1) {
    iVar1 = (int)(ref & 0xff);
    switch((uint)ref & 0xff) {
    case 2:
      lVar3 = *(long *)((long)art->nodes + (ulong)(uint)(iVar1 << 3));
      lVar5 = (ref >> 0x10) * *(long *)((long)ART_NODE_SIZES + (ulong)(uint)(iVar1 << 3));
      if (*(char *)(lVar3 + 6 + lVar5) != '\0') {
        lVar3 = lVar3 + lVar5;
        uVar4 = 0;
        do {
          aVar2 = art_move_node_to_shrink(art,*(art_ref_t *)(lVar3 + 0x10 + uVar4 * 8));
          *(art_ref_t *)(lVar3 + 0x10 + uVar4 * 8) = aVar2;
          art_shrink_at(art,aVar2);
          uVar4 = uVar4 + 1;
        } while (uVar4 < *(byte *)(lVar3 + 6));
      }
      break;
    case 3:
      lVar3 = *(long *)((long)art->nodes + (ulong)(uint)(iVar1 << 3));
      lVar5 = (ref >> 0x10) * *(long *)((long)ART_NODE_SIZES + (ulong)(uint)(iVar1 << 3));
      if (*(char *)(lVar3 + 6 + lVar5) != '\0') {
        lVar3 = lVar3 + lVar5;
        uVar4 = 0;
        do {
          aVar2 = art_move_node_to_shrink(art,*(art_ref_t *)(lVar3 + 0x18 + uVar4 * 8));
          *(art_ref_t *)(lVar3 + 0x18 + uVar4 * 8) = aVar2;
          art_shrink_at(art,aVar2);
          uVar4 = uVar4 + 1;
        } while (uVar4 < *(byte *)(lVar3 + 6));
      }
      break;
    case 4:
      lVar3 = (ref >> 0x10) * *(long *)((long)ART_NODE_SIZES + (ulong)(uint)(iVar1 << 3)) +
              *(long *)((long)art->nodes + (ulong)(uint)(iVar1 << 3));
      lVar5 = 0;
      do {
        uVar4 = (ulong)*(byte *)(lVar3 + 0x10 + lVar5);
        if (uVar4 != 0x30) {
          aVar2 = art_move_node_to_shrink(art,*(art_ref_t *)(lVar3 + 0x110 + uVar4 * 8));
          *(art_ref_t *)(lVar3 + 0x110 + uVar4 * 8) = aVar2;
          art_shrink_at(art,aVar2);
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0x100);
      break;
    case 5:
      lVar3 = (ref >> 0x10) * *(long *)((long)ART_NODE_SIZES + (ulong)(uint)(iVar1 << 3)) +
              *(long *)((long)art->nodes + (ulong)(uint)(iVar1 << 3)) + 8;
      lVar5 = 0;
      do {
        aVar2 = *(art_ref_t *)(lVar3 + lVar5 * 8);
        if (aVar2 != 0) {
          aVar2 = art_move_node_to_shrink(art,aVar2);
          *(art_ref_t *)(lVar3 + lVar5 * 8) = aVar2;
          art_shrink_at(art,aVar2);
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0x100);
    }
  }
  return;
}

Assistant:

static void art_shrink_at(art_t *art, art_ref_t ref) {
    if (art_is_leaf(ref)) {
        return;
    }
    switch (art_ref_typecode(ref)) {
        case CROARING_ART_NODE4_TYPE: {
            art_node4_t *node4 = (art_node4_t *)art_deref(art, ref);
            for (uint8_t i = 0; i < node4->count; ++i) {
                node4->children[i] =
                    art_move_node_to_shrink(art, node4->children[i]);
                art_shrink_at(art, node4->children[i]);
            }
        } break;
        case CROARING_ART_NODE16_TYPE: {
            art_node16_t *node16 = (art_node16_t *)art_deref(art, ref);
            for (uint8_t i = 0; i < node16->count; ++i) {
                node16->children[i] =
                    art_move_node_to_shrink(art, node16->children[i]);
                art_shrink_at(art, node16->children[i]);
            }
        } break;
        case CROARING_ART_NODE48_TYPE: {
            art_node48_t *node48 = (art_node48_t *)art_deref(art, ref);
            for (int i = 0; i < 256; ++i) {
                if (node48->keys[i] != CROARING_ART_NODE48_EMPTY_VAL) {
                    uint8_t idx = node48->keys[i];
                    node48->children[idx] =
                        art_move_node_to_shrink(art, node48->children[idx]);
                    art_shrink_at(art, node48->children[idx]);
                }
            }
        } break;
        case CROARING_ART_NODE256_TYPE: {
            art_node256_t *node256 = (art_node256_t *)art_deref(art, ref);
            for (int i = 0; i < 256; ++i) {
                if (node256->children[i] != CROARING_ART_NULL_REF) {
                    node256->children[i] =
                        art_move_node_to_shrink(art, node256->children[i]);
                    art_shrink_at(art, node256->children[i]);
                }
            }
        } break;
        default:
            assert(false);
            break;
    }
}